

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_Touch(char *zPath,jx9_int64 touch_time,jx9_int64 access_time)

{
  int iVar1;
  undefined1 auStack_38 [4];
  int rc;
  utimbuf ut;
  jx9_int64 access_time_local;
  jx9_int64 touch_time_local;
  char *zPath_local;
  
  _auStack_38 = access_time;
  ut.actime = touch_time;
  ut.modtime = access_time;
  iVar1 = utime(zPath,(utimbuf *)auStack_38);
  if (iVar1 == 0) {
    zPath_local._4_4_ = 0;
  }
  else {
    zPath_local._4_4_ = -1;
  }
  return zPath_local._4_4_;
}

Assistant:

static int UnixVfs_Touch(const char *zPath, jx9_int64 touch_time, jx9_int64 access_time)
{
	struct utimbuf ut;
	int rc;
	ut.actime  = (time_t)access_time;
	ut.modtime = (time_t)touch_time;
	rc = utime(zPath, &ut);
	if( rc != 0 ){
	 return -1;
	}
	return JX9_OK;
}